

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QEventPoint * __thiscall QMap<int,_QEventPoint>::operator[](QMap<int,_QEventPoint> *this,int *key)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
  *pQVar3;
  _Base_ptr p_Var4;
  _Rb_tree_iterator<std::pair<const_int,_QEventPoint>_> _Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QEventPoint>_>,_bool> pVar6;
  QEventPoint local_48;
  pair<const_int,_QEventPoint> local_40;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_*>
          )(QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar3 = (this->d).d.ptr;
  p_Var4 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    iVar2 = *key;
    _Var5._M_node = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var4[1]._M_color) {
        _Var5._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var5._M_node != p_Var1) && ((int)_Var5._M_node[1]._M_color <= iVar2))
    goto LAB_0031bbcc;
  }
  QEventPoint::QEventPoint(&local_48,-1,(QPointingDevice *)0x0);
  local_40.second.d.d.ptr = local_48.d.d.ptr;
  local_40.first = *key;
  local_48.d.d.ptr =
       (QExplicitlySharedDataPointer<QEventPointPrivate>)
       (totally_ordered_wrapper<QEventPointPrivate_*>)0x0;
  pVar6 = std::
          _Rb_tree<int,std::pair<int_const,QEventPoint>,std::_Select1st<std::pair<int_const,QEventPoint>>,std::less<int>,std::allocator<std::pair<int_const,QEventPoint>>>
          ::_M_insert_unique<std::pair<int_const,QEventPoint>>
                    ((_Rb_tree<int,std::pair<int_const,QEventPoint>,std::_Select1st<std::pair<int_const,QEventPoint>>,std::less<int>,std::allocator<std::pair<int_const,QEventPoint>>>
                      *)&pQVar3->m,&local_40);
  _Var5 = pVar6.first._M_node;
  QEventPoint::~QEventPoint(&local_40.second);
  QEventPoint::~QEventPoint(&local_48);
LAB_0031bbcc:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QEventPoint *)&_Var5._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }